

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fioldobj(void *ctx0,mclhd handle,uchar *ptr,ushort siz)

{
  int iVar1;
  uint siz_00;
  size_t sVar2;
  ushort in_CX;
  uchar *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  uint rdsiz;
  errcxdef *ec;
  char buf [7];
  osfildef *fp;
  ulong seekpos;
  fiolcxdef *ctx;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char local_3f [3];
  undefined1 auStack_3c [2];
  undefined1 auStack_3a [2];
  FILE *local_38;
  undefined8 *local_28;
  ushort local_1a;
  uchar *local_18;
  
  local_38 = (FILE *)*in_RDI;
  local_28 = in_RDI;
  local_1a = in_CX;
  local_18 = in_RDX;
  fseek(local_38,in_RSI + in_RDI[2],0);
  sVar2 = fread(local_3f,7,1,local_38);
  if (sVar2 != 1) {
    errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            in_stack_ffffffffffffffa8,0);
  }
  iVar1 = (int)local_3f[0];
  if (iVar1 == 1) {
    siz_00 = osrp2(auStack_3c);
  }
  else {
    if (iVar1 != 2) {
      errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffffb4,iVar1),in_stack_ffffffffffffffa8,0);
    }
    siz_00 = osrp2(auStack_3a);
  }
  if (local_1a < siz_00) {
    errsigf((errcxdef *)CONCAT44(siz_00,iVar1),in_stack_ffffffffffffffa8,0);
  }
  sVar2 = fread(local_18,(ulong)siz_00,1,local_38);
  if (sVar2 != 1) {
    errsigf((errcxdef *)CONCAT44(siz_00,iVar1),in_stack_ffffffffffffffa8,0);
  }
  if ((*(uint *)(local_28 + 3) & 8) != 0) {
    fioxor(local_18,siz_00,*(uint *)((long)local_28 + 0x1c),*(uint *)(local_28 + 4));
  }
  return;
}

Assistant:

void OS_LOADDS fioldobj(void *ctx0, mclhd handle, uchar *ptr, ushort siz)
{
    fiolcxdef  *ctx = (fiolcxdef *)ctx0;
    ulong       seekpos = (ulong)handle;
    osfildef   *fp = ctx->fiolcxfp;
    char        buf[7];
    errcxdef   *ec = ctx->fiolcxerr;
    uint        rdsiz;
    
    /* figure out what type of object is to be loaded */
    osfseek(fp, seekpos + ctx->fiolcxst, OSFSK_SET);
    if (osfrb(fp, buf, 7)) errsig(ec, ERR_LDGAM);
    switch(buf[0])
    {
    case TOKSTFUNC:
        rdsiz = osrp2(buf + 3);
        break;

    case TOKSTOBJ:
        rdsiz = osrp2(buf + 5);
        break;
        
    case TOKSTFWDOBJ:
    case TOKSTFWDFN:
    default:
        errsig(ec, ERR_UNKOTYP);
    }
    
    if (siz < rdsiz) errsig(ec, ERR_LDBIG);
    if (osfrb(fp, ptr, rdsiz)) errsig(ec, ERR_LDGAM);
    if (ctx->fiolcxflg & FIOFCRYPT)
        fioxor(ptr, rdsiz, ctx->fiolcxseed, ctx->fiolcxinc);
}